

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

wchar_t number_charging(object *obj)

{
  int iVar1;
  wchar_t local_20;
  wchar_t num_charging;
  wchar_t charge_time;
  object *obj_local;
  
  iVar1 = randcalc(obj->time,0,AVERAGE);
  if (iVar1 < 1) {
    obj_local._4_4_ = L'\0';
  }
  else if (obj->timeout < 1) {
    obj_local._4_4_ = L'\0';
  }
  else {
    local_20 = (obj->timeout + iVar1 + -1) / iVar1;
    if ((int)(uint)obj->number < local_20) {
      local_20 = (wchar_t)obj->number;
    }
    obj_local._4_4_ = local_20;
  }
  return obj_local._4_4_;
}

Assistant:

int number_charging(const struct object *obj)
{
	int charge_time, num_charging;

	charge_time = randcalc(obj->time, 0, AVERAGE);

	/* Item has no timeout */
	if (charge_time <= 0) return 0;

	/* No items are charging */
	if (obj->timeout <= 0) return 0;

	/* Calculate number charging based on timeout */
	num_charging = (obj->timeout + charge_time - 1) / charge_time;

	/* Number charging cannot exceed stack size */
	if (num_charging > obj->number) num_charging = obj->number;

	return num_charging;
}